

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

bool __thiscall mjs::object::property::key_matches(property *this,gc_heap *h,wstring_view k)

{
  bool bVar1;
  gc_string *pgVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  
  pgVar2 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&this->key_,h);
  __x._M_len = (ulong)pgVar2->length_;
  __x._M_str = (wchar_t *)(pgVar2 + 1);
  bVar1 = std::operator==(__x,k);
  return bVar1;
}

Assistant:

bool key_matches(gc_heap& h, const std::wstring_view k) { return key_.dereference(h).view() == k; }